

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O0

void __thiscall
Diligent::FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(FixedBlockMemoryAllocator *this)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  Char *pCVar4;
  undefined1 local_68 [8];
  string msg_1;
  _Node_iterator_base<unsigned_long,_false> local_40;
  undefined1 local_38 [8];
  string msg;
  size_t p;
  FixedBlockMemoryAllocator *this_local;
  
  for (msg.field_2._8_8_ = 0; uVar1 = msg.field_2._8_8_,
      sVar3 = std::
              vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
              ::size(&this->m_PagePool), (ulong)uVar1 < sVar3;
      msg.field_2._8_8_ = msg.field_2._8_8_ + 1) {
    this_00 = std::
              vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
              ::operator[](&this->m_PagePool,msg.field_2._8_8_);
    bVar2 = MemoryPage::HasAllocations(this_00);
    if (bVar2) {
      FormatString<char[54]>
                ((string *)local_38,
                 (char (*) [54])"Memory leak detected: memory page has allocated block");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"~FixedBlockMemoryAllocator",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                 ,0xc4);
      std::__cxx11::string::~string((string *)local_38);
    }
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>_>
         ::find(&this->m_AvailablePages,(key_type *)(msg.field_2._M_local_buf + 8));
    msg_1.field_2._8_8_ =
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>_>
         ::end(&this->m_AvailablePages);
    bVar2 = std::__detail::operator!=
                      (&local_40,
                       (_Node_iterator_base<unsigned_long,_false> *)((long)&msg_1.field_2 + 8));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      FormatString<char[46]>
                ((string *)local_68,(char (*) [46])"Memory page is not in the available page pool");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"~FixedBlockMemoryAllocator",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                 ,0xc5);
      std::__cxx11::string::~string((string *)local_68);
    }
  }
  std::
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>_>
  ::~unordered_map(&this->m_AddrToPageId);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>_>
  ::~unordered_set(&this->m_AvailablePages);
  std::
  vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
  ::~vector(&this->m_PagePool);
  return;
}

Assistant:

FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator()
{
#ifdef DILIGENT_DEBUG
    for (size_t p = 0; p < m_PagePool.size(); ++p)
    {
        VERIFY(!m_PagePool[p].HasAllocations(), "Memory leak detected: memory page has allocated block");
        VERIFY(m_AvailablePages.find(p) != m_AvailablePages.end(), "Memory page is not in the available page pool");
    }
#endif
}